

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallInScopeThatHappened_Test::
~TEST_MockCallTest_expectNoCallInScopeThatHappened_Test
          (TEST_MockCallTest_expectNoCallInScopeThatHappened_Test *this)

{
  TEST_MockCallTest_expectNoCallInScopeThatHappened_Test *this_local;
  
  ~TEST_MockCallTest_expectNoCallInScopeThatHappened_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeThatHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "scope::lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope::lazy", expectations);

    mock("scope").expectNoCall("lazy");
    mock("scope").actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}